

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_1::logAttribList(EglTestContext *eglTestCtx,EGLint *attribList)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int *piVar4;
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  MessageBuilder local_328;
  ostringstream local_198 [8];
  ostringstream attribListString;
  int *local_20;
  EGLint *iter;
  EGLint *attribList_local;
  EglTestContext *eglTestCtx_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_20 = attribList;
  while (*local_20 != 0x3038) {
    iVar1 = *local_20;
    if (iVar1 == 0x3098) {
      poVar2 = std::operator<<((ostream *)local_198,"EGL_CONTEXT_CLIENT_VERSION, ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20[1]);
      std::operator<<(poVar2,", ");
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 0x30bf) {
      piVar4 = local_20 + 1;
      std::operator<<((ostream *)local_198,"EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ");
      if ((*piVar4 == 0) || (*piVar4 == 1)) {
        pcVar3 = "status == EGL_FALSE";
        if (*piVar4 != 0) {
          pcVar3 = "status == EGL_TRUE";
        }
        poVar2 = std::operator<<((ostream *)local_198,pcVar3 + 10);
        std::operator<<(poVar2,", ");
      }
      else {
        poVar2 = (ostream *)std::ostream::operator<<(local_198,*piVar4);
        std::operator<<(poVar2,", ");
      }
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 0x30fb) {
      poVar2 = std::operator<<((ostream *)local_198,"EGL_CONTEXT_MINOR_VERSION_KHR, ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20[1]);
      std::operator<<(poVar2,", ");
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 0x3138) {
      poVar2 = std::operator<<((ostream *)local_198,
                               "EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, ");
      pcVar3 = eglResetNotificationStrategyToString(local_20[1]);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,", ");
      local_20 = local_20 + 2;
    }
  }
  std::operator<<((ostream *)local_198,"EGL_NONE");
  this = EglTestContext::getTestContext(eglTestCtx);
  this_00 = tcu::TestContext::getLog(this);
  tcu::TestLog::operator<<(&local_328,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_328,(char (*) [20])"EGL attrib list: { ");
  std::__cxx11::ostringstream::str();
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_348);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [5])" }\n\n");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_348);
  tcu::MessageBuilder::~MessageBuilder(&local_328);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void logAttribList (const EglTestContext& eglTestCtx, const EGLint* attribList)
{
	const EGLint*		iter = &(attribList[0]);
	std::ostringstream	attribListString;

	while ((*iter) != EGL_NONE)
	{
		switch (*iter)
		{
		//	case EGL_CONTEXT_CLIENT_VERSION:
			case EGL_CONTEXT_MAJOR_VERSION_KHR:
				iter++;
				attribListString << "EGL_CONTEXT_CLIENT_VERSION, " << (*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_MINOR_VERSION_KHR:
				iter++;
				attribListString << "EGL_CONTEXT_MINOR_VERSION_KHR, " << (*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT:
				iter++;
				attribListString << "EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, "
								 << eglResetNotificationStrategyToString(*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT:
				iter++;
				attribListString << "EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ";

				if (*iter == EGL_FALSE || *iter == EGL_TRUE)
					attribListString << (*iter ? "EGL_TRUE" : "EGL_FALSE") << ", ";
				else
					attribListString << (*iter) << ", ";
				iter++;
				break;

			default:
				DE_FATAL("Unsupported attribute");
		}
	}

	attribListString << "EGL_NONE";
	eglTestCtx.getTestContext().getLog() << TestLog::Message
										 << "EGL attrib list: { " << attribListString.str() << " }\n\n"
										 << TestLog::EndMessage;
}